

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::PushID(char *str_id_begin,char *str_id_end)

{
  int iVar1;
  ImGuiWindow *this;
  uint *__src;
  ImGuiID IVar2;
  uint *__dest;
  int iVar3;
  int iVar4;
  
  this = GImGui->CurrentWindow;
  IVar2 = ImGuiWindow::GetID(this,str_id_begin,str_id_end);
  iVar4 = (this->IDStack).Size;
  iVar1 = (this->IDStack).Capacity;
  if (iVar4 == iVar1) {
    iVar4 = iVar4 + 1;
    if (iVar1 == 0) {
      iVar3 = 8;
    }
    else {
      iVar3 = iVar1 / 2 + iVar1;
    }
    if (iVar4 < iVar3) {
      iVar4 = iVar3;
    }
    if (iVar1 < iVar4) {
      __dest = (uint *)MemAlloc((long)iVar4 << 2);
      __src = (this->IDStack).Data;
      if (__src != (uint *)0x0) {
        memcpy(__dest,__src,(long)(this->IDStack).Size << 2);
        MemFree((this->IDStack).Data);
      }
      (this->IDStack).Data = __dest;
      (this->IDStack).Capacity = iVar4;
    }
  }
  (this->IDStack).Data[(this->IDStack).Size] = IVar2;
  (this->IDStack).Size = (this->IDStack).Size + 1;
  return;
}

Assistant:

void ImGui::PushID(const char* str_id_begin, const char* str_id_end)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiID id = window->GetID(str_id_begin, str_id_end);
    window->IDStack.push_back(id);
}